

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::PrefixedExpr(SQCompiler *this)

{
  long lVar1;
  SQFuncState *pSVar2;
  SQFuncState *this_00;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInteger arg0;
  SQInteger arg3;
  SQObject SVar6;
  SQInteger ttarget;
  SQInteger closure;
  SQInteger table;
  SQInteger key;
  SQInteger tmp2;
  SQInteger tmp1;
  SQInteger src;
  SQInteger diff;
  SQObject local_28;
  SQInteger local_18;
  SQInteger pos;
  SQCompiler *this_local;
  
  pos = (SQInteger)this;
  local_18 = Factor(this);
  while( true ) {
    while( true ) {
      while (lVar1 = this->_token, lVar1 == 0x28) {
        lVar1 = (this->_es).etype;
        if (lVar1 == 2) {
          SVar4 = SQFuncState::PopTarget(this->_fs);
          SVar5 = SQFuncState::PopTarget(this->_fs);
          arg0 = SQFuncState::PushTarget(this->_fs,-1);
          arg3 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(this->_fs,_OP_PREPCALL,arg0,SVar4,SVar5,arg3);
        }
        else if (lVar1 == 3) {
          pSVar2 = this->_fs;
          SVar4 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(pSVar2,_OP_MOVE,SVar4,0,0,0);
        }
        else if (lVar1 == 5) {
          pSVar2 = this->_fs;
          SVar4 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(pSVar2,_OP_GETOUTER,SVar4,(this->_es).epos,0,0);
          pSVar2 = this->_fs;
          SVar4 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(pSVar2,_OP_MOVE,SVar4,0,0,0);
        }
        else {
          pSVar2 = this->_fs;
          SVar4 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(pSVar2,_OP_MOVE,SVar4,0,0,0);
        }
        (this->_es).etype = 1;
        Lex(this);
        FunctionCallArgs(this,false);
      }
      if (lVar1 != 0x2e) break;
      local_18 = -1;
      Lex(this);
      pSVar2 = this->_fs;
      SVar4 = SQFuncState::PushTarget(this->_fs,-1);
      this_00 = this->_fs;
      SVar6 = Expect(this,0x102);
      local_28._unVal = SVar6._unVal;
      local_28._type = SVar6._type;
      SVar5 = SQFuncState::GetConstant(this_00,&local_28);
      SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar4,SVar5,0,0);
      if ((this->_es).etype == 3) {
        Emit2ArgsOP(this,_OP_GET,0);
        local_18 = SQFuncState::TopTarget(this->_fs);
        (this->_es).etype = 1;
        (this->_es).epos = local_18;
      }
      else {
        bVar3 = NeedGet(this);
        if (bVar3) {
          Emit2ArgsOP(this,_OP_GET,0);
        }
        (this->_es).etype = 2;
      }
    }
    if (lVar1 != 0x5b) break;
    if ((this->_lex)._prevtoken == 10) {
      Error(this,"cannot brake deref/or comma needed after [exp]=exp slot declaration");
    }
    Lex(this);
    Expression(this);
    Expect(this,0x5d);
    local_18 = -1;
    if ((this->_es).etype == 3) {
      Emit2ArgsOP(this,_OP_GET,0);
      local_18 = SQFuncState::TopTarget(this->_fs);
      (this->_es).etype = 1;
      (this->_es).epos = local_18;
    }
    else {
      bVar3 = NeedGet(this);
      if (bVar3) {
        Emit2ArgsOP(this,_OP_GET,0);
      }
      (this->_es).etype = 2;
    }
  }
  if ((lVar1 - 0x12fU < 2) && (bVar3 = IsEndOfStatement(this), !bVar3)) {
    lVar1 = (ulong)(this->_token != 0x130) * 2 + -1;
    Lex(this);
    switch((this->_es).etype) {
    case 1:
      Error(this,"can\'t \'++\' or \'--\' an expression");
      break;
    case 2:
    case 3:
      if (((this->_es).donot_get & 1U) == 1) {
        Error(this,"can\'t \'++\' or \'--\' an expression");
      }
      else {
        Emit2ArgsOP(this,_OP_PINC,lVar1);
      }
      break;
    case 4:
      SVar4 = SQFuncState::PopTarget(this->_fs);
      pSVar2 = this->_fs;
      SVar5 = SQFuncState::PushTarget(this->_fs,-1);
      SQFuncState::AddInstruction(pSVar2,_OP_PINCL,SVar5,SVar4,0,lVar1);
      break;
    case 5:
      SVar4 = SQFuncState::PushTarget(this->_fs,-1);
      SVar5 = SQFuncState::PushTarget(this->_fs,-1);
      SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar5,(this->_es).epos,0,0);
      SQFuncState::AddInstruction(this->_fs,_OP_PINCL,SVar4,SVar5,0,lVar1);
      SQFuncState::AddInstruction(this->_fs,_OP_SETOUTER,SVar5,(this->_es).epos,SVar5,0);
      SQFuncState::PopTarget(this->_fs);
    }
  }
  return;
}

Assistant:

void PrefixedExpr()
    {
        SQInteger pos = Factor();
        for(;;) {
            switch(_token) {
            case _SC('.'):
                pos = -1;
                Lex();

                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case _SC('['):
                if(_lex._prevtoken == _SC('\n')) Error(_SC("cannot brake deref/or comma needed after [exp]=exp slot declaration"));
                Lex(); Expression(); Expect(_SC(']'));
                pos = -1;
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case TK_MINUSMINUS:
            case TK_PLUSPLUS:
                {
                    if(IsEndOfStatement()) return;
                    SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                    Lex();
                    switch(_es.etype)
                    {
                        case EXPR: Error(_SC("can't '++' or '--' an expression")); break;
                        case OBJECT:
                        case BASE:
                            if(_es.donot_get == true)  { Error(_SC("can't '++' or '--' an expression")); break; } //mmh dor this make sense?
                            Emit2ArgsOP(_OP_PINC, diff);
                            break;
                        case LOCAL: {
                            SQInteger src = _fs->PopTarget();
                            _fs->AddInstruction(_OP_PINCL, _fs->PushTarget(), src, 0, diff);
                                    }
                            break;
                        case OUTER: {
                            SQInteger tmp1 = _fs->PushTarget();
                            SQInteger tmp2 = _fs->PushTarget();
                            _fs->AddInstruction(_OP_GETOUTER, tmp2, _es.epos);
                            _fs->AddInstruction(_OP_PINCL,    tmp1, tmp2, 0, diff);
                            _fs->AddInstruction(_OP_SETOUTER, tmp2, _es.epos, tmp2);
                            _fs->PopTarget();
                        }
                    }
                }
                return;
                break;
            case _SC('('):
                switch(_es.etype) {
                    case OBJECT: {
                        SQInteger key     = _fs->PopTarget();  /* location of the key */
                        SQInteger table   = _fs->PopTarget();  /* location of the object */
                        SQInteger closure = _fs->PushTarget(); /* location for the closure */
                        SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
                        _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
                        }
                        break;
                    case BASE:
                        //Emit2ArgsOP(_OP_GET);
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                        break;
                    case OUTER:
                        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), _es.epos);
                        _fs->AddInstruction(_OP_MOVE,     _fs->PushTarget(), 0);
                        break;
                    default:
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                }
                _es.etype = EXPR;
                Lex();
                FunctionCallArgs();
                break;
            default: return;
            }
        }
    }